

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool subDeprecatedOption(TidyDocImpl *doc,ctmbstr oldName,ctmbstr oldValue)

{
  Bool BVar1;
  int iVar2;
  TidyOptionImpl *pTVar3;
  ctmbstr ptVar4;
  ctmbstr val;
  TidyDoc p_Stack_40;
  uint value;
  TidyDoc tdoc;
  ctmbstr newName;
  ctmbstr ptStack_28;
  TidyOptionId newOptId;
  ctmbstr oldValue_local;
  ctmbstr oldName_local;
  TidyDocImpl *doc_local;
  
  ptStack_28 = oldValue;
  oldValue_local = oldName;
  oldName_local = (ctmbstr)doc;
  newName._4_4_ = getOptionReplacement(oldName);
  pTVar3 = prvTidygetOption(newName._4_4_);
  tdoc = (TidyDoc)pTVar3->name;
  p_Stack_40 = (TidyDoc)oldName_local;
  BVar1 = isOptionDeprecated(oldValue_local);
  if (BVar1 == no) {
    __assert_fail("isOptionDeprecated(oldName)",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/config.c"
                  ,0x28a,"Bool subDeprecatedOption(TidyDocImpl *, ctmbstr, ctmbstr)");
  }
  if (newName._4_4_ == TidyUnknownOption) {
    prvTidyReport((TidyDocImpl *)oldName_local,(Node *)0x0,(Node *)0x0,0x26a,oldValue_local);
    doc_local._4_4_ = no;
  }
  else {
    iVar2 = prvTidytmbstrcasecmp(oldValue_local,"show-body-only");
    if (iVar2 == 0) {
      BVar1 = GetPickListValue(ptStack_28,&autoBoolPicks,(uint *)((long)&val + 4));
      if (BVar1 == no) {
        prvTidyReportBadArgument((TidyDocImpl *)oldName_local,oldValue_local);
      }
      else if (val._4_4_ == 0) {
        prvTidySetOptionInt((TidyDocImpl *)oldName_local,newName._4_4_,0);
        prvTidyReport((TidyDocImpl *)oldName_local,(Node *)0x0,(Node *)0x0,0x26c,oldValue_local,tdoc
                     );
      }
      else {
        prvTidySetOptionInt((TidyDocImpl *)oldName_local,newName._4_4_,(ulong)val._4_4_);
        ptVar4 = tidyOptGetCurrPick(p_Stack_40,newName._4_4_);
        prvTidyReport((TidyDocImpl *)oldName_local,(Node *)0x0,(Node *)0x0,0x26b,oldValue_local,tdoc
                      ,ptVar4);
      }
      doc_local._4_4_ = yes;
    }
    else {
      doc_local._4_4_ = no;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static Bool subDeprecatedOption( TidyDocImpl* doc, ctmbstr oldName, ctmbstr oldValue)
{
    TidyOptionId newOptId = getOptionReplacement( oldName );
    ctmbstr newName = TY_(getOption)( newOptId )->name;
    TidyDoc tdoc = tidyImplToDoc( doc );

    assert( isOptionDeprecated(oldName));

    if ( newOptId == TidyUnknownOption )
    {
        TY_(Report)( doc, NULL, NULL, OPTION_REMOVED, oldName );
        return no;
    }

    /********************/
    /* `show-body-only` */
    /********************/
    if ( TY_(tmbstrcasecmp)( oldName, "show-body-only" ) == 0 )
    {
        uint value;

        /* `show-body-only` used to use the autoBoolPicks */
        if ( GetPickListValue( oldValue, &autoBoolPicks, &value ) )
        {
            if ( value == TidyNoState )
            {
                TY_(SetOptionInt)( doc, newOptId, value );
                TY_(Report)( doc, NULL, NULL, OPTION_REMOVED_UNAPPLIED, oldName, newName );
            }
            else
            {
                ctmbstr val;
                TY_(SetOptionInt)( doc, newOptId, value );
                val = tidyOptGetCurrPick( tdoc, newOptId );
                TY_(Report)( doc, NULL, NULL, OPTION_REMOVED_APPLIED, oldName, newName, val );
            }
        }
        else
        {
            TY_(ReportBadArgument)(doc, oldName);
        }
        return yes;
    }

    return no;
}